

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexedBWT.h
# Opt level: O2

vector<bool,_std::allocator<bool>_> * __thiscall
bwtil::IndexedBWT::markPositions
          (vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,IndexedBWT *this,bool verbose
          )

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  vector<bool,_std::allocator<bool>_> *pvVar3;
  ulong uVar4;
  ostream *poVar5;
  ulint __n;
  undefined7 in_register_00000011;
  long lVar6;
  ulong uVar7;
  ulint uVar8;
  reference rVar9;
  allocator_type local_42;
  bool local_41;
  vector<bool,_std::allocator<bool>_> *local_40;
  int local_34;
  
  local_41 = false;
  local_40 = __return_storage_ptr__;
  std::vector<bool,_std::allocator<bool>_>::vector
            (__return_storage_ptr__,this->n,&local_41,&local_42);
  uVar8 = this->n;
  local_34 = (int)CONCAT71(in_register_00000011,verbose);
  if (local_34 != 0) {
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  lVar6 = -uVar8;
  uVar7 = 1;
  __n = 0;
  while (pvVar3 = local_40, lVar6 = lVar6 + 1, uVar8 = uVar8 - 1, lVar6 != 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = this->n;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (lVar6 + this->n) * 100;
    uVar4 = SUB168(auVar2 / auVar1,0);
    if (((int)uVar7 != SUB164(auVar2 / auVar1,0) & (byte)local_34 &
        (int)((uVar4 & 0xffffffff) % 10) == 0) == 1) {
      poVar5 = std::operator<<((ostream *)&std::cout,"   ");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::operator<<(poVar5,"% done.\n");
      uVar7 = uVar4 & 0xffffffff;
    }
    if (uVar8 % this->offrate == 0) {
      rVar9 = std::vector<bool,_std::allocator<bool>_>::at(local_40,__n);
      *rVar9._M_p = *rVar9._M_p | rVar9._M_mask;
    }
    __n = LF(this,__n);
  }
  rVar9 = std::vector<bool,_std::allocator<bool>_>::at(local_40,__n);
  *rVar9._M_p = *rVar9._M_p | rVar9._M_mask;
  return pvVar3;
}

Assistant:

vector<bool> markPositions(bool verbose){//mark 1 every offrate positions of the text on the bwt (vector marked_positions)

		auto marked_pos_vec = vector<bool>(n,false);

		ulint i=n-1;//current position on text
		ulint j=0;  //current position on the BWT (0=terminator position on the F column)
		uint perc;
		uint last_perc=1;

		if(verbose) cout << endl;

		while(i>0){

			perc = (100*(n-i))/n;

			if(verbose)
				if(perc%10==0 and perc!= last_perc){

					cout << "   " << perc << "% done.\n";
					last_perc=perc;

				}

			if(i%offrate==0)
				marked_pos_vec.at(j)=true;

			j = LF(j);

			i--;

		}

		//i=0
		marked_pos_vec.at(j)=true;
		//marked_positions.setBit(j,1);
		//marked_positions.computeRanks();

		return marked_pos_vec;

	}